

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFDie::getLowAndHighPC
          (DWARFDie *this,uint64_t *LowPC,uint64_t *HighPC,uint64_t *SectionIndex)

{
  byte bVar1;
  Optional<unsigned_long> OVar2;
  undefined1 local_80 [8];
  Optional<llvm::DWARFFormValue> F;
  Optional<llvm::object::SectionedAddress> LowPcAddr;
  
  find((Optional<llvm::DWARFFormValue> *)local_80,this,DW_AT_low_pc);
  if (F.Storage.field_0._40_1_ == '\x01') {
    DWARFFormValue::getAsSectionedAddress
              ((Optional<llvm::object::SectionedAddress> *)&F.Storage.hasVal,
               (DWARFFormValue *)local_80);
  }
  else {
    F.Storage.hasVal = false;
    LowPcAddr.Storage.field_0.value.SectionIndex._0_1_ = 0;
  }
  if (LowPcAddr.Storage.field_0.value.SectionIndex._0_1_ == '\x01') {
    OVar2 = getHighPC(this,CONCAT71(F.Storage._49_7_,F.Storage.hasVal));
    bVar1 = OVar2.Storage.hasVal;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *LowPC = CONCAT71(F.Storage._49_7_,F.Storage.hasVal);
      *HighPC = (uint64_t)OVar2.Storage.field_0;
      *SectionIndex = LowPcAddr.Storage.field_0.value.Address;
    }
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool DWARFDie::getLowAndHighPC(uint64_t &LowPC, uint64_t &HighPC,
                               uint64_t &SectionIndex) const {
  auto F = find(DW_AT_low_pc);
  auto LowPcAddr = toSectionedAddress(F);
  if (!LowPcAddr)
    return false;
  if (auto HighPcAddr = getHighPC(LowPcAddr->Address)) {
    LowPC = LowPcAddr->Address;
    HighPC = *HighPcAddr;
    SectionIndex = LowPcAddr->SectionIndex;
    return true;
  }
  return false;
}